

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O0

void __thiscall CustomLayer::write_param(CustomLayer *this,FILE *pp)

{
  void *pvVar1;
  uint uVar2;
  FILE *pFVar3;
  uint uVar4;
  FILE *in_RSI;
  long in_RDI;
  float fVar5;
  int j_1;
  float *p_1;
  int len_1;
  Mat v_1;
  int j;
  int *p;
  int len;
  Mat v;
  int type;
  int i;
  int local_28c;
  Mat local_278;
  Mat local_230;
  int local_1e4;
  void *local_1e0;
  uint local_1d8;
  Mat local_1c8;
  Mat local_180;
  int local_138;
  uint local_134;
  FILE *local_130;
  Mat *local_120;
  Mat *local_118;
  Mat *local_110;
  Mat *local_100;
  Mat *local_f0;
  Mat *local_e0;
  Mat *local_d0;
  int local_b8;
  undefined4 local_b4;
  Mat *local_b0;
  int local_98;
  undefined4 local_94;
  Mat *local_90;
  int local_78;
  undefined4 local_74;
  Mat *local_70;
  int local_58;
  undefined4 local_54;
  Mat *local_50;
  void *local_48;
  void *local_38;
  void *local_28;
  void *local_18;
  Mat *local_8;
  
  local_130 = in_RSI;
  for (local_134 = 0; (int)local_134 < 0x20; local_134 = local_134 + 1) {
    local_138 = ncnn::ParamDict::type((ParamDict *)(in_RDI + 0xd0),local_134);
    pFVar3 = local_130;
    uVar2 = local_134;
    if (local_138 != 0) {
      if (local_138 == 2) {
        uVar4 = ncnn::ParamDict::get((ParamDict *)(in_RDI + 0xd0),local_134,0);
        fprintf(pFVar3," %d=%d",(ulong)uVar2,(ulong)uVar4);
      }
      pFVar3 = local_130;
      uVar2 = local_134;
      if (local_138 == 3) {
        fVar5 = ncnn::ParamDict::get((ParamDict *)(in_RDI + 0xd0),local_134,0.0);
        fprintf(pFVar3," %d=%e",(double)fVar5,(ulong)uVar2);
      }
      if (local_138 == 5) {
        local_120 = &local_1c8;
        local_1c8.data = (void *)0x0;
        local_1c8.refcount = (int *)0x0;
        local_1c8.elemsize = 0;
        local_1c8.elempack = 0;
        local_1c8.allocator = (Allocator *)0x0;
        local_1c8.dims = 0;
        local_1c8.w = 0;
        local_1c8.h = 0;
        local_1c8.d = 0;
        local_1c8.c = 0;
        local_1c8.cstep = 0;
        ncnn::ParamDict::get(&local_180,(ParamDict *)(in_RDI + 0xd0),local_134,local_120);
        local_110 = &local_1c8;
        local_50 = local_110;
        if (local_1c8.refcount != (int *)0x0) {
          local_54 = 0xffffffff;
          LOCK();
          local_58 = *local_1c8.refcount;
          *local_1c8.refcount = *local_1c8.refcount + -1;
          UNLOCK();
          if (local_58 == 1) {
            if (local_1c8.allocator == (Allocator *)0x0) {
              local_48 = local_1c8.data;
              if (local_1c8.data != (void *)0x0) {
                free(local_1c8.data);
              }
            }
            else {
              (*(local_1c8.allocator)->_vptr_Allocator[3])(local_1c8.allocator,local_1c8.data);
            }
          }
        }
        local_1c8.data = (void *)0x0;
        local_1c8.elemsize = 0;
        local_1c8.elempack = 0;
        local_1c8.dims = 0;
        local_1c8.w = 0;
        local_1c8.h = 0;
        local_1c8.d = 0;
        local_1c8.c = 0;
        local_1c8.cstep = 0;
        local_1c8.refcount = (int *)0x0;
        local_1d8 = local_180.w;
        fprintf(local_130," %d=%d",(ulong)(0xffffa4fc - local_134),(ulong)(uint)local_180.w);
        local_d0 = &local_180;
        local_1e0 = local_180.data;
        for (local_1e4 = 0; local_1e4 < (int)local_1d8; local_1e4 = local_1e4 + 1) {
          fprintf(local_130,",%d",(ulong)*(uint *)((long)local_1e0 + (long)local_1e4 * 4));
        }
        local_100 = &local_180;
        local_70 = local_100;
        if (local_180.refcount != (int *)0x0) {
          local_74 = 0xffffffff;
          LOCK();
          local_78 = *local_180.refcount;
          *local_180.refcount = *local_180.refcount + -1;
          UNLOCK();
          if (local_78 == 1) {
            if (local_180.allocator == (Allocator *)0x0) {
              local_38 = local_180.data;
              if (local_180.data != (void *)0x0) {
                free(local_180.data);
              }
            }
            else {
              (*(local_180.allocator)->_vptr_Allocator[3])(local_180.allocator,local_180.data);
            }
          }
        }
        local_180.data = (void *)0x0;
        local_180.elemsize = 0;
        local_180.elempack = 0;
        local_180.dims = 0;
        local_180.w = 0;
        local_180.h = 0;
        local_180.d = 0;
        local_180.c = 0;
        local_180.cstep = 0;
        local_180.refcount = (int *)0x0;
      }
      if (local_138 == 6) {
        local_118 = &local_278;
        local_278.data = (void *)0x0;
        local_278.refcount = (int *)0x0;
        local_278.elemsize = 0;
        local_278.elempack = 0;
        local_278.allocator = (Allocator *)0x0;
        local_278.dims = 0;
        local_278.w = 0;
        local_278.h = 0;
        local_278.d = 0;
        local_278.c = 0;
        local_278.cstep = 0;
        ncnn::ParamDict::get(&local_230,(ParamDict *)(in_RDI + 0xd0),local_134,local_118);
        local_f0 = &local_278;
        local_90 = local_f0;
        if (local_278.refcount != (int *)0x0) {
          local_94 = 0xffffffff;
          LOCK();
          local_98 = *local_278.refcount;
          *local_278.refcount = *local_278.refcount + -1;
          UNLOCK();
          if (local_98 == 1) {
            if (local_278.allocator == (Allocator *)0x0) {
              local_28 = local_278.data;
              if (local_278.data != (void *)0x0) {
                free(local_278.data);
              }
            }
            else {
              (*(local_278.allocator)->_vptr_Allocator[3])(local_278.allocator,local_278.data);
            }
          }
        }
        local_278.data = (void *)0x0;
        local_278.elemsize = 0;
        local_278.elempack = 0;
        local_278.dims = 0;
        local_278.w = 0;
        local_278.h = 0;
        local_278.d = 0;
        local_278.c = 0;
        local_278.cstep = 0;
        local_278.refcount = (int *)0x0;
        fprintf(local_130," %d=%d",(ulong)(0xffffa4fc - local_134),(ulong)(uint)local_230.w);
        pvVar1 = local_230.data;
        local_8 = &local_230;
        for (local_28c = 0; local_28c < local_230.w; local_28c = local_28c + 1) {
          fprintf(local_130,",%e",(double)*(float *)((long)pvVar1 + (long)local_28c * 4));
        }
        local_e0 = &local_230;
        local_b0 = local_e0;
        if (local_230.refcount != (int *)0x0) {
          local_b4 = 0xffffffff;
          LOCK();
          local_b8 = *local_230.refcount;
          *local_230.refcount = *local_230.refcount + -1;
          UNLOCK();
          if (local_b8 == 1) {
            if (local_230.allocator == (Allocator *)0x0) {
              local_18 = local_230.data;
              if (local_230.data != (void *)0x0) {
                free(local_230.data);
              }
            }
            else {
              (*(local_230.allocator)->_vptr_Allocator[3])(local_230.allocator,local_230.data);
            }
          }
        }
        local_230.data = (void *)0x0;
        local_230.elemsize = 0;
        local_230.elempack = 0;
        local_230.dims = 0;
        local_230.w = 0;
        local_230.h = 0;
        local_230.d = 0;
        local_230.c = 0;
        local_230.cstep = 0;
        local_230.refcount = (int *)0x0;
      }
    }
  }
  return;
}

Assistant:

void write_param(FILE* pp)
    {
        for (int i = 0; i < NCNN_MAX_PARAM_COUNT; i++)
        {
            int type = mpd.type(i);
            if (type == 0)
                continue;

            if (type == 2)
            {
                fprintf(pp, " %d=%d", i, mpd.get(i, 0));
            }
            if (type == 3)
            {
                fprintf(pp, " %d=%e", i, mpd.get(i, 0.f));
            }
            if (type == 5)
            {
                ncnn::Mat v = mpd.get(i, ncnn::Mat());
                int len = v.w;
                fprintf(pp, " %d=%d", -i - 23300, len);
                const int* p = v;
                for (int j = 0; j < len; j++)
                {
                    fprintf(pp, ",%d", p[j]);
                }
            }
            if (type == 6)
            {
                ncnn::Mat v = mpd.get(i, ncnn::Mat());
                int len = v.w;
                fprintf(pp, " %d=%d", -i - 23300, len);
                const float* p = v;
                for (int j = 0; j < len; j++)
                {
                    fprintf(pp, ",%e", p[j]);
                }
            }
        }
    }